

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndicapi.cxx
# Opt level: O2

unsigned_long ndiGetGXFrame(ndicapi *pol,int port)

{
  unsigned_long uVar1;
  char (*string) [8];
  
  if (port - 0x31U < 3) {
    string = pol->GxFrame + (port - 0x31U);
  }
  else {
    if (8 < port - 0x41U) {
      return 0;
    }
    string = pol->GxPassiveFrame + (port - 0x41U);
  }
  uVar1 = ndiHexToUnsignedLong(*string,8);
  return uVar1;
}

Assistant:

ndicapiExport unsigned long ndiGetGXFrame(ndicapi* pol, int port)
{
  char* dp;

  if (port >= '1' && port <= '3')
  {
    dp = pol->GxFrame[port - '1'];
  }
  else if (port >= 'A' && port <= 'I')
  {
    dp = pol->GxPassiveFrame[port - 'A'];
  }
  else
  {
    return 0;
  }

  return (unsigned long)ndiHexToUnsignedLong(dp, 8);
}